

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O1

u32 __thiscall moira::Moira::addsub<(moira::Core)1,(moira::Instr)252,1>(Moira *this,u32 op1,u32 op2)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = (ulong)(this->reg).sr.x + (ulong)op2 + (ulong)op1;
  bVar3 = (bool)((byte)(uVar2 >> 8) & 1);
  (this->reg).sr.c = bVar3;
  (this->reg).sr.x = bVar3;
  bVar1 = (byte)uVar2;
  (this->reg).sr.v = (bool)((byte)(((byte)op2 ^ bVar1) & ((byte)op1 ^ bVar1)) >> 7);
  if (bVar1 != 0) {
    (this->reg).sr.z = false;
  }
  (this->reg).sr.n = (bool)((byte)((uVar2 & 0xffffffff) >> 7) & 1);
  return (u32)uVar2;
}

Assistant:

u32
Moira::addsub(u32 op1, u32 op2)
{
    u64 result;

    switch (I) {

        case Instr::ADD:
        case Instr::ADD_LOOP:
        case Instr::ADDI:
        case Instr::ADDQ:
        {
            result = U64_ADD(op1, op2);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ result) & (op2 ^ result));
            reg.sr.z = ZERO<S>(result);
            break;
        }
        case Instr::ADDX:
        case Instr::ADDX_LOOP:
        {
            result = U64_ADD3(op1, op2, reg.sr.x);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ result) & (op2 ^ result));
            if (CLIP<S>(result)) reg.sr.z = 0;
            break;
        }
        case Instr::SUB:
        case Instr::SUB_LOOP:
        case Instr::SUBI:
        case Instr::SUBQ:
        {
            result = U64_SUB(op2, op1);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ op2) & (op2 ^ result));
            reg.sr.z = ZERO<S>(result);
            break;
        }
        case Instr::SUBX:
        case Instr::SUBX_LOOP:
        {
            result = U64_SUB3(op2, op1, reg.sr.x);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ op2) & (op2 ^ result));
            if (CLIP<S>(result)) reg.sr.z = 0;
            break;
        }

        default:
            fatalError;
    }

    reg.sr.n = NBIT<S>(result);

    return (u32)result;
}